

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void test_empty(void)

{
  bool bVar1;
  assertion_failed *paVar2;
  small_function<void_(),_8UL,_8UL> local_38 [2];
  undefined1 local_18 [8];
  small_function<void_(),_8UL,_8UL> fn;
  
  avakar::small_function<void_(),_8UL,_8UL>::small_function
            ((small_function<void_(),_8UL,_8UL> *)local_18);
  bVar1 = avakar::_small_function::impl::operator_cast_to_bool((impl *)local_18);
  if (bVar1) {
    paVar2 = (assertion_failed *)__cxa_allocate_exception(0x10);
    assertion_failed::runtime_error
              (paVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/avakar[P]small_function/test/test.cpp(20): assertion failed: !fn"
              );
    __cxa_throw(paVar2,&assertion_failed::typeinfo,assertion_failed::~assertion_failed);
  }
  avakar::small_function<void_(),_8UL,_8UL>::impl(local_38);
  avakar::small_function<void_(),_8UL,_8UL>::operator=
            ((small_function<void_(),_8UL,_8UL> *)local_18,local_38);
  avakar::small_function<void_(),_8UL,_8UL>::~small_function(local_38);
  bVar1 = avakar::_small_function::impl::operator_cast_to_bool((impl *)local_18);
  if (!bVar1) {
    paVar2 = (assertion_failed *)__cxa_allocate_exception(0x10);
    assertion_failed::runtime_error
              (paVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/avakar[P]small_function/test/test.cpp(23): assertion failed: fn"
              );
    __cxa_throw(paVar2,&assertion_failed::typeinfo,assertion_failed::~assertion_failed);
  }
  avakar::small_function<void_(),_8UL,_8UL>::~small_function
            ((small_function<void_(),_8UL,_8UL> *)local_18);
  return;
}

Assistant:

static void test_empty()
{
	small_function<void()> fn;
	require(!fn);

	fn = [] {};
	require(fn);
}